

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.h
# Opt level: O0

int __thiscall despot::util::tinyxml::TiXmlString::init(TiXmlString *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Rep *pRVar3;
  size_type in_RDX;
  size_type intsNeeded;
  size_type bytesNeeded;
  size_type cap_local;
  size_type sz_local;
  TiXmlString *this_local;
  
  if (in_RDX == 0) {
    this->rep_ = (Rep *)nullrep_;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDX + 0x1b >> 2;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pRVar3 = (Rep *)operator_new__(uVar2);
    this->rep_ = pRVar3;
    pRVar3 = this->rep_;
    this->rep_->size = (size_type)ctx;
    pRVar3->str[(long)ctx] = '\0';
    this = (TiXmlString *)this->rep_;
    ((Rep *)this)->capacity = in_RDX;
  }
  return (int)this;
}

Assistant:

void init(size_type sz, size_type cap) {
		if (cap) {
			// Lee: the original form:
			//	rep_ = static_cast<Rep*>(operator new(sizeof(Rep) + cap));
			// doesn't work in some cases of new being overloaded. Switching
			// to the normal allocation, although use an 'int' for systems
			// that are overly picky about structure alignment.
			const size_type bytesNeeded = sizeof(Rep) + cap;
			const size_type intsNeeded = (bytesNeeded + sizeof(int) - 1)
				/ sizeof(int);
			rep_ = reinterpret_cast<Rep*>(new int[intsNeeded]);

			rep_->str[rep_->size = sz] = '\0';
			rep_->capacity = cap;
		} else {
			rep_ = &nullrep_;
		}
	}